

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWidget * __thiscall QWidget::window(QWidget *this)

{
  QWidgetData **ppQVar1;
  QWidget *pQVar2;
  QWidget *w;
  QWidget *pQVar3;
  
  do {
    pQVar3 = this;
    pQVar2 = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
    if (pQVar2 == (QWidget *)0x0) {
      return pQVar3;
    }
    ppQVar1 = &this->data;
    this = pQVar2;
  } while ((((*ppQVar1)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  return pQVar3;
}

Assistant:

QWidget *QWidget::window() const
{
    QWidget *w = const_cast<QWidget *>(this);
    QWidget *p = w->parentWidget();
    while (!w->isWindow() && p) {
        w = p;
        p = p->parentWidget();
    }
    return w;
}